

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::applyForces(btSoftBody *this)

{
  long in_RDI;
  btScalar bVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  btVector3 bVar4;
  Node *n;
  int ni;
  int i;
  sMedium medium;
  btScalar dvolumetv;
  btScalar ivolumetp;
  btScalar volume;
  bool use_volume;
  bool use_medium;
  int in_stack_000000e4;
  bool as_aero;
  bool as_volume;
  bool as_pressure;
  bool as_drag;
  bool as_lift;
  btScalar kVC;
  btScalar kPR;
  btScalar kDG;
  btScalar kLF;
  CProfileSample __profile;
  int in_stack_00000174;
  btVector3 *in_stack_00000178;
  btSoftBody *in_stack_00000180;
  char *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined1 in_stack_ffffffffffffff08 [16];
  bool local_a1;
  bool local_91;
  undefined4 in_stack_ffffffffffffff70;
  btScalar in_stack_ffffffffffffff74;
  btVector3 local_78;
  Node *local_68;
  int local_5c;
  int local_58;
  float local_30;
  float local_2c;
  float local_28;
  bool local_23;
  bool local_22;
  bool local_21;
  byte local_20;
  byte local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  
  CProfileSample::CProfileSample
            ((CProfileSample *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8);
  local_10 = *(float *)(in_RDI + 0x188);
  local_14 = *(float *)(in_RDI + 0x184);
  local_18 = *(float *)(in_RDI + 0x18c);
  local_1c = *(float *)(in_RDI + 400);
  local_1d = 0.0 < local_10;
  local_1e = 0.0 < local_14;
  local_1f = local_18 != 0.0;
  local_20 = 0.0 < local_1c;
  local_91 = (bool)local_1d || (bool)local_1e;
  local_21 = local_91;
  local_22 = local_91;
  local_a1 = (bool)local_1f || (bool)local_20;
  local_23 = local_a1;
  local_28 = 0.0;
  local_2c = 0.0;
  local_30 = 0.0;
  sMedium::sMedium((sMedium *)0x276e68);
  if ((local_23 & 1U) != 0) {
    local_28 = getVolume((btSoftBody *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                        );
    bVar1 = btFabs(local_28);
    local_2c = (1.0 / bVar1) * local_18;
    local_30 = (*(float *)(in_RDI + 0x25c) - local_28) * local_1c;
  }
  local_58 = 0;
  local_5c = btAlignedObjectArray<btSoftBody::Node>::size
                       ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
  for (; local_58 < local_5c; local_58 = local_58 + 1) {
    local_68 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_58);
    if (0.0 < local_68->m_im) {
      if ((local_22 & 1U) != 0) {
        addAeroForceToNode(_kPR,_as_volume,in_stack_000000e4);
      }
      if ((local_1f & 1) != 0) {
        bVar4 = ::operator*(in_stack_ffffffffffffff08._8_8_,in_stack_ffffffffffffff08._0_8_);
        local_78.m_floats._8_8_ = bVar4.m_floats._8_8_;
        local_78.m_floats._0_8_ = bVar4.m_floats._0_8_;
        btVector3::operator+=(&local_68->m_f,&local_78);
      }
      if ((local_20 & 1) != 0) {
        uVar2 = 0;
        uVar3 = 0;
        bVar4 = ::operator*(in_stack_ffffffffffffff08._8_8_,in_stack_ffffffffffffff08._0_8_);
        in_stack_ffffffffffffff08._8_4_ = uVar2;
        in_stack_ffffffffffffff08._0_8_ = bVar4.m_floats._8_8_;
        in_stack_ffffffffffffff08._12_4_ = uVar3;
        btVector3::operator+=(&local_68->m_f,(btVector3 *)&stack0xffffffffffffff74);
      }
    }
  }
  local_58 = 0;
  local_5c = btAlignedObjectArray<btSoftBody::Face>::size
                       ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0));
  for (; local_58 < local_5c; local_58 = local_58 + 1) {
    addAeroForceToFace(in_stack_00000180,in_stack_00000178,in_stack_00000174);
  }
  CProfileSample::~CProfileSample((CProfileSample *)0x277168);
  return;
}

Assistant:

void				btSoftBody::applyForces()
{

	BT_PROFILE("SoftBody applyForces");
//	const btScalar					dt =			m_sst.sdt;
	const btScalar					kLF =			m_cfg.kLF;
	const btScalar					kDG =			m_cfg.kDG;
	const btScalar					kPR =			m_cfg.kPR;
	const btScalar					kVC =			m_cfg.kVC;
	const bool						as_lift =		kLF>0;
	const bool						as_drag =		kDG>0;
	const bool						as_pressure =	kPR!=0;
	const bool						as_volume =		kVC>0;
	const bool						as_aero =		as_lift	||
													as_drag		;
	//const bool						as_vaero =		as_aero	&&
	//												(m_cfg.aeromodel < btSoftBody::eAeroModel::F_TwoSided);
	//const bool						as_faero =		as_aero	&&
	//												(m_cfg.aeromodel >= btSoftBody::eAeroModel::F_TwoSided);
	const bool						use_medium =	as_aero;
	const bool						use_volume =	as_pressure	||
		as_volume	;
	btScalar						volume =		0;
	btScalar						ivolumetp =		0;
	btScalar						dvolumetv =		0;
	btSoftBody::sMedium	medium;
	if(use_volume)
	{
		volume		=	getVolume();
		ivolumetp	=	1/btFabs(volume)*kPR;
		dvolumetv	=	(m_pose.m_volume-volume)*kVC;
	}
	/* Per vertex forces			*/ 
	int i,ni;

	for(i=0,ni=m_nodes.size();i<ni;++i)
	{
		btSoftBody::Node&	n=m_nodes[i];
		if(n.m_im>0)
		{
			if(use_medium)
			{
				/* Aerodynamics			*/ 
				addAeroForceToNode(m_windVelocity, i);
			}
			/* Pressure				*/ 
			if(as_pressure)
			{
				n.m_f	+=	n.m_n*(n.m_area*ivolumetp);
			}
			/* Volume				*/ 
			if(as_volume)
			{
				n.m_f	+=	n.m_n*(n.m_area*dvolumetv);
			}
		}
	}

	/* Per face forces				*/ 
	for(i=0,ni=m_faces.size();i<ni;++i)
	{
	//	btSoftBody::Face&	f=m_faces[i];

		/* Aerodynamics			*/ 
		addAeroForceToFace(m_windVelocity, i);	
	}
}